

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_doors.cpp
# Opt level: O2

bool EV_SlidingDoor(line_t_conflict *line,AActor *actor,int tag,int speed,int delay)

{
  TObjPtr<DSectorEffect> *obj;
  line_t_conflict *line_00;
  PClass *pPVar1;
  bool bVar2;
  uint uVar3;
  DSectorEffect *pDVar4;
  FDoorAnimation *pFVar5;
  DAnimatedDoor *pDVar6;
  PClass *pPVar7;
  long lVar8;
  sector_t_conflict *psVar9;
  FSectorTagIterator it;
  FSectorTagIterator local_38;
  
  if (tag == 0) {
    psVar9 = line->backsector;
    obj = &psVar9->ceilingdata;
    pDVar4 = GC::ReadBarrier<DSectorEffect>((DSectorEffect **)obj);
    if (pDVar4 == (DSectorEffect *)0x0) {
      pFVar5 = FTextureManager::FindAnimatedDoor
                         (&TexMan,(FTextureID)line->sidedef[0]->textures[0].texture.texnum);
      if (pFVar5 != (FDoorAnimation *)0x0) {
        pDVar6 = (DAnimatedDoor *)DObject::operator_new(0x88);
        DAnimatedDoor::DAnimatedDoor(pDVar6,(sector_t *)psVar9,line,speed,delay,pFVar5);
        return true;
      }
    }
    else if (actor->player != (player_t *)0x0) {
      pDVar4 = GC::ReadBarrier<DSectorEffect>((DSectorEffect **)obj);
      pPVar1 = DAnimatedDoor::RegistrationInfo.MyClass;
      pPVar7 = DObject::GetClass((DObject *)pDVar4);
      if ((pPVar7 == pPVar1) &&
         (pDVar6 = (DAnimatedDoor *)GC::ReadBarrier<DSectorEffect>((DSectorEffect **)obj),
         pDVar6->m_Status == 1)) {
        bVar2 = DAnimatedDoor::StartClosing(pDVar6);
        return bVar2;
      }
    }
    bVar2 = false;
  }
  else {
    local_38.start = tagManager.TagHashFirst[(ulong)(uint)tag & 0xff];
    bVar2 = false;
    local_38.searchtag = tag;
LAB_003f7f11:
    uVar3 = FSectorTagIterator::Next(&local_38);
    psVar9 = sectors;
    if (-1 < (int)uVar3) {
      pDVar4 = GC::ReadBarrier<DSectorEffect>((DSectorEffect **)&sectors[uVar3].ceilingdata);
      if (pDVar4 == (DSectorEffect *)0x0) {
        psVar9 = psVar9 + uVar3;
        for (lVar8 = 0; lVar8 < psVar9->linecount; lVar8 = lVar8 + 1) {
          line_00 = psVar9->lines[lVar8];
          if ((line_00->backsector != (sector_t_conflict *)0x0) &&
             (pFVar5 = FTextureManager::FindAnimatedDoor
                                 (&TexMan,(FTextureID)
                                          line_00->sidedef[0]->textures[0].texture.texnum),
             pFVar5 != (FDoorAnimation *)0x0)) {
            pDVar6 = (DAnimatedDoor *)DObject::operator_new(0x88);
            bVar2 = true;
            DAnimatedDoor::DAnimatedDoor(pDVar6,(sector_t *)psVar9,line_00,speed,delay,pFVar5);
            break;
          }
        }
      }
      goto LAB_003f7f11;
    }
  }
  return bVar2;
}

Assistant:

bool EV_SlidingDoor (line_t *line, AActor *actor, int tag, int speed, int delay)
{
	sector_t *sec;
	int secnum;
	bool rtn;

	secnum = -1;
	rtn = false;

	if (tag == 0)
	{
		// Manual sliding door
		sec = line->backsector;

		// Make sure door isn't already being animated
		if (sec->ceilingdata != NULL)
		{
			if (actor->player == NULL)
				return false;

			if (sec->ceilingdata->IsA (RUNTIME_CLASS(DAnimatedDoor)))
			{
				DAnimatedDoor *door = barrier_cast<DAnimatedDoor *>(sec->ceilingdata);
				if (door->m_Status == DAnimatedDoor::Waiting)
				{
					return door->StartClosing();
				}
			}
			return false;
		}
		FDoorAnimation *anim = TexMan.FindAnimatedDoor (line->sidedef[0]->GetTexture(side_t::top));
		if (anim != NULL)
		{
			new DAnimatedDoor (sec, line, speed, delay, anim);
			return true;
		}
		return false;
	}

	FSectorTagIterator it(tag);
	while ((secnum = it.Next()) >= 0)
	{
		sec = &sectors[secnum];
		if (sec->ceilingdata != NULL)
		{
			continue;
		}

		for (int i = 0; tag != 0 && i < sec->linecount; ++i)
		{
			line = sec->lines[i];
			if (line->backsector == NULL)
			{
				continue;
			}
			FDoorAnimation *anim = TexMan.FindAnimatedDoor (line->sidedef[0]->GetTexture(side_t::top));
			if (anim != NULL)
			{
				rtn = true;
				new DAnimatedDoor (sec, line, speed, delay, anim);
				break;
			}
		}
	}
	return rtn;
}